

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long mkvparser::VideoTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               VideoTrack **pResult)

{
  IMkvReader *pReader;
  _Head_base<0UL,_mkvparser::Projection_*,_false> _Var1;
  Colour *pCVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  longlong lVar6;
  long lVar7;
  VideoTrack *pVVar8;
  long lVar9;
  long unaff_R14;
  longlong pos;
  longlong size;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  Projection *projection;
  double rate;
  char *colour_space;
  longlong id;
  long local_c8;
  longlong local_c0;
  _Head_base<0UL,_mkvparser::Projection_*,_false> local_b8;
  Colour *local_b0;
  Colour *local_a8;
  longlong local_a0;
  longlong local_98;
  longlong local_90;
  longlong local_88;
  longlong local_80;
  longlong local_78;
  double local_70;
  char *local_68;
  VideoTrack **local_60;
  Segment *local_58;
  longlong local_50;
  longlong local_48;
  Info *local_40;
  long local_38;
  
  lVar9 = -1;
  if ((*pResult == (VideoTrack *)0x0) && (info->type == 1)) {
    local_70 = 0.0;
    local_68 = (char *)0x0;
    local_c8 = (info->settings).start;
    if (local_c8 < 0) {
      __assert_fail("s.start >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x14cf,
                    "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                   );
    }
    lVar9 = (info->settings).size;
    local_60 = pResult;
    local_50 = element_start;
    local_48 = element_size;
    local_40 = info;
    if (lVar9 < 0) {
      __assert_fail("s.size >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x14d0,
                    "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                   );
    }
    pReader = pSegment->m_pReader;
    lVar9 = lVar9 + local_c8;
    local_b0 = (Colour *)0x0;
    local_78 = 0;
    local_b8._M_head_impl = (Projection *)0x0;
    local_80 = 0;
    local_88 = 0;
    local_90 = 0;
    local_98 = 0;
    local_a0 = 0;
    local_58 = pSegment;
    do {
      if (lVar9 <= local_c8) {
        unaff_R14 = -2;
        if (local_c8 == lVar9) {
          pVVar8 = (VideoTrack *)operator_new(0x110,(nothrow_t *)&std::nothrow);
          if (pVVar8 == (VideoTrack *)0x0) {
            pVVar8 = (VideoTrack *)0x0;
          }
          else {
            (pVVar8->super_Track).m_pSegment = local_58;
            (pVVar8->super_Track).m_element_start = local_50;
            (pVVar8->super_Track).m_element_size = local_48;
            (pVVar8->super_Track).m_info.uid = 0;
            (pVVar8->super_Track).m_info.defaultDuration = 0;
            (pVVar8->super_Track).m_info.codecDelay = 0;
            (pVVar8->super_Track).m_info.seekPreRoll = 0;
            (pVVar8->super_Track).m_info.nameAsUTF8 = (char *)0x0;
            (pVVar8->super_Track).m_info.language = (char *)0x0;
            (pVVar8->super_Track).m_info.codecId = (char *)0x0;
            (pVVar8->super_Track).m_info.codecNameAsUTF8 = (char *)0x0;
            (pVVar8->super_Track).m_info.codecPrivate = (uchar *)0x0;
            (pVVar8->super_Track).m_info.codecPrivateSize = 0;
            (pVVar8->super_Track).m_info.lacing = false;
            (pVVar8->super_Track).m_eos.super_BlockEntry.m_pCluster = (Cluster *)0x0;
            (pVVar8->super_Track).m_eos.super_BlockEntry.m_index = -0x8000000000000000;
            (pVVar8->super_Track).m_eos.super_BlockEntry._vptr_BlockEntry =
                 (_func_int **)&PTR__BlockEntry_0013fba8;
            (pVVar8->super_Track).content_encoding_entries_ = (ContentEncoding **)0x0;
            (pVVar8->super_Track).content_encoding_entries_end_ = (ContentEncoding **)0x0;
            (pVVar8->super_Track)._vptr_Track = (_func_int **)&PTR__VideoTrack_0013fbd8;
            pVVar8->m_colour_space = (char *)0x0;
            pVVar8->m_colour = (Colour *)0x0;
            pVVar8->m_projection = (Projection *)0x0;
          }
          unaff_R14 = -1;
          if (pVVar8 != (VideoTrack *)0x0) {
            iVar4 = Track::Info::Copy(local_40,&(pVVar8->super_Track).m_info);
            pCVar2 = local_b0;
            _Var1._M_head_impl = local_b8._M_head_impl;
            if (iVar4 == 0) {
              pVVar8->m_width = local_a0;
              pVVar8->m_height = local_98;
              pVVar8->m_display_width = local_90;
              pVVar8->m_display_height = local_88;
              pVVar8->m_display_unit = local_80;
              pVVar8->m_stereo_mode = local_78;
              pVVar8->m_rate = local_70;
              unaff_R14 = 0;
              local_b0 = (Colour *)0x0;
              pVVar8->m_colour = pCVar2;
              pVVar8->m_colour_space = local_68;
              local_b8._M_head_impl = (Projection *)0x0;
              pVVar8->m_projection = _Var1._M_head_impl;
              *local_60 = pVVar8;
            }
            else {
              (*(pVVar8->super_Track)._vptr_Track[1])(pVVar8);
            }
          }
        }
        break;
      }
      lVar5 = ParseElementHeader(pReader,&local_c8,lVar9,&local_38,&local_c0);
      if (lVar5 < 0) {
LAB_0012de0a:
        bVar3 = false;
        unaff_R14 = lVar5;
      }
      else {
        if (local_38 < 0x54ba) {
          if (local_38 < 0x53b8) {
            if (local_38 == 0xb0) {
              local_a0 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_a0;
            }
            else {
              if (local_38 != 0xba) goto LAB_0012de50;
              local_98 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_98;
            }
joined_r0x0012dd39:
            if (lVar6 < 1) {
LAB_0012de03:
              lVar5 = -2;
              goto LAB_0012de0a;
            }
          }
          else {
            if (local_38 == 0x53b8) {
              local_78 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_78;
            }
            else {
              if (local_38 == 0x54b0) {
                local_90 = UnserializeUInt(pReader,local_c8,local_c0);
                lVar6 = local_90;
                goto joined_r0x0012dd39;
              }
              if (local_38 != 0x54b2) goto LAB_0012de50;
              local_80 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_80;
            }
            if (lVar6 < 0) goto LAB_0012de03;
          }
        }
        else {
          if (local_38 < 0x7670) {
            if (local_38 == 0x54ba) {
              local_88 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_88;
              goto joined_r0x0012dd39;
            }
            if (local_38 != 0x55b0) goto LAB_0012de50;
            local_a8 = (Colour *)0x0;
            bVar3 = Colour::Parse(pReader,local_c8,local_c0,&local_a8);
            pCVar2 = local_b0;
            lVar5 = -2;
            if ((bVar3) && (local_b0 = local_a8, lVar5 = unaff_R14, pCVar2 != (Colour *)0x0)) {
              Colour::~Colour(pCVar2);
              operator_delete(pCVar2);
            }
          }
          else {
            if (local_38 != 0x7670) {
              if (local_38 == 0x2383e3) {
                lVar7 = UnserializeFloat(pReader,local_c8,local_c0,&local_70);
                if (local_70 <= 0.0) {
                  unaff_R14 = -2;
                }
                if (lVar7 < 0) {
                  unaff_R14 = lVar7;
                }
                lVar5 = unaff_R14;
                if (lVar7 < 0 || local_70 <= 0.0) goto LAB_0012de0a;
              }
              else if ((local_38 == 0x2eb524) &&
                      (lVar5 = UnserializeString(pReader,local_c8,local_c0,&local_68), lVar5 < 0)) {
                bVar3 = false;
                unaff_R14 = lVar5;
                goto LAB_0012de71;
              }
              goto LAB_0012de50;
            }
            local_a8 = (Colour *)0x0;
            bVar3 = Projection::Parse(pReader,local_c8,local_c0,(Projection **)&local_a8);
            lVar5 = -2;
            if (bVar3) {
              std::
              __uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
              reset((__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     *)&local_b8,(pointer)local_a8);
              lVar5 = unaff_R14;
            }
          }
          unaff_R14 = lVar5;
          if (bVar3 == false) {
            bVar3 = false;
            goto LAB_0012de71;
          }
        }
LAB_0012de50:
        local_c8 = local_c8 + local_c0;
        bVar3 = local_c8 <= lVar9;
        if (lVar9 < local_c8) {
          unaff_R14 = -2;
        }
      }
LAB_0012de71:
    } while (bVar3);
    _Var1._M_head_impl = local_b8._M_head_impl;
    if (local_b8._M_head_impl != (Projection *)0x0) {
      if ((local_b8._M_head_impl)->private_data != (uchar *)0x0) {
        operator_delete__((local_b8._M_head_impl)->private_data);
      }
      operator_delete(_Var1._M_head_impl);
    }
    pCVar2 = local_b0;
    lVar9 = unaff_R14;
    if (local_b0 != (Colour *)0x0) {
      Colour::~Colour(local_b0);
      operator_delete(pCVar2);
    }
  }
  return lVar9;
}

Assistant:

long VideoTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       VideoTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kVideo)
    return -1;

  long long width = 0;
  long long height = 0;
  long long display_width = 0;
  long long display_height = 0;
  long long display_unit = 0;
  long long stereo_mode = 0;

  double rate = 0.0;
  char* colour_space = NULL;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  std::unique_ptr<Colour> colour_ptr;
  std::unique_ptr<Projection> projection_ptr;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvPixelWidth) {
      width = UnserializeUInt(pReader, pos, size);

      if (width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvPixelHeight) {
      height = UnserializeUInt(pReader, pos, size);

      if (height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayWidth) {
      display_width = UnserializeUInt(pReader, pos, size);

      if (display_width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayHeight) {
      display_height = UnserializeUInt(pReader, pos, size);

      if (display_height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayUnit) {
      display_unit = UnserializeUInt(pReader, pos, size);

      if (display_unit < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvStereoMode) {
      stereo_mode = UnserializeUInt(pReader, pos, size);

      if (stereo_mode < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvFrameRate) {
      const long status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvColour) {
      Colour* colour = NULL;
      if (!Colour::Parse(pReader, pos, size, &colour)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        colour_ptr.reset(colour);
      }
    } else if (id == libwebm::kMkvProjection) {
      Projection* projection = NULL;
      if (!Projection::Parse(pReader, pos, size, &projection)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        projection_ptr.reset(projection);
      }
    } else if (id == libwebm::kMkvColourSpace) {
      const long status = UnserializeString(pReader, pos, size, colour_space);
      if (status < 0)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  VideoTrack* const pTrack =
      new (std::nothrow) VideoTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pTrack->m_width = width;
  pTrack->m_height = height;
  pTrack->m_display_width = display_width;
  pTrack->m_display_height = display_height;
  pTrack->m_display_unit = display_unit;
  pTrack->m_stereo_mode = stereo_mode;
  pTrack->m_rate = rate;
  pTrack->m_colour = colour_ptr.release();
  pTrack->m_colour_space = colour_space;
  pTrack->m_projection = projection_ptr.release();

  pResult = pTrack;
  return 0;  // success
}